

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grid.h
# Opt level: O0

void __thiscall despot::Grid<int>::Grid(Grid<int> *this,int xsize,int ysize)

{
  int ysize_local;
  int xsize_local;
  Grid<int> *this_local;
  
  this->xsize_ = xsize;
  this->ysize_ = ysize;
  std::vector<int,_std::allocator<int>_>::vector(&this->grid_);
  std::vector<int,_std::allocator<int>_>::resize(&this->grid_,(long)(xsize * ysize));
  return;
}

Assistant:

Grid(int xsize, int ysize) :
		xsize_(xsize),
		ysize_(ysize) {
		grid_.resize(xsize * ysize);
	}